

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

int __thiscall
glslang::TDefaultGlslIoResolver::resolveBinding
          (TDefaultGlslIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  TSlotMap *this_00;
  TResourceType set;
  char cVar1;
  int iVar2;
  int size;
  TResourceType res;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  mapped_type *pmVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  *this_01;
  iterator iVar7;
  mapped_type *pmVar8;
  TResourceType set_00;
  int resourceKey;
  TResourceType local_44;
  EShLanguage local_40;
  int local_3c;
  key_type *local_38;
  long *plVar4;
  
  local_40 = stage;
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  size = 1;
  if (((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl != 0) &&
     (cVar1 = (**(code **)(*plVar4 + 0xf0))(plVar4), cVar1 != '\0')) {
    size = (**(code **)(*plVar4 + 0x88))(plVar4);
  }
  res = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                  (this,plVar4);
  if ((res == EResUbo) && (iVar3 = (**(code **)(*plVar4 + 0x38))(plVar4), iVar3 != 0x10)) {
LAB_003e9d1f:
    ent->newBinding = -1;
    return -1;
  }
  set_00 = res;
  if ((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl == 0) {
    set_00 = ent->newSet;
  }
  if (5 < (int)res) goto LAB_003e9d1f;
  local_44 = set_00;
  local_38 = (key_type *)CONCAT44(extraout_var_00,iVar2);
  lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
  if ((short)((ulong)*(undefined8 *)(lVar5 + 0x1c) >> 0x20) != -1) {
    iVar2 = TDefaultIoResolverBase::getBaseBinding
                      (&this->super_TDefaultIoResolverBase,local_40,res,set_00);
    lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
    iVar2 = (uint)*(ushort *)(lVar5 + 0x20) + iVar2;
    TDefaultIoResolverBase::reserveSlot(&this->super_TDefaultIoResolverBase,set_00,iVar2,size);
    ent->newBinding = iVar2;
    return iVar2;
  }
  ent->newBinding = -1;
  this_00 = &this->resourceSlotMap;
  local_3c = size;
  pmVar6 = std::
           map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
           ::operator[](this_00,(key_type_conflict1 *)&local_44);
  if ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_003e9d6e:
    set = local_44;
    if ((ent->live != true) ||
       (((this->super_TDefaultIoResolverBase).referenceIntermediate)->autoMapBindings != true))
    goto LAB_003e9dcb;
    iVar2 = TDefaultIoResolverBase::getBaseBinding
                      (&this->super_TDefaultIoResolverBase,local_40,res,set_00);
    iVar2 = TDefaultIoResolverBase::getFreeSlot
                      (&this->super_TDefaultIoResolverBase,set,iVar2,local_3c);
    pmVar6 = std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
             ::operator[](this_00,(key_type_conflict1 *)&local_44);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
             ::operator[](pmVar6,local_38);
    *pmVar8 = iVar2;
  }
  else {
    this_01 = &std::
               map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
               ::operator[](this_00,(key_type_conflict1 *)&local_44)->_M_t;
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
            ::find(this_01,local_38);
    pmVar6 = std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
             ::operator[](this_00,(key_type_conflict1 *)&local_44);
    if ((_Rb_tree_header *)iVar7._M_node == &(pmVar6->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_003e9d6e;
    iVar2 = *(int *)&iVar7._M_node[2]._M_parent;
  }
  ent->newBinding = iVar2;
LAB_003e9dcb:
  return ent->newBinding;
}

Assistant:

int TDefaultGlslIoResolver::resolveBinding(EShLanguage stage, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    // On OpenGL arrays of opaque types take a separate binding for each element
    int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
    TResourceType resource = getResourceType(type);
    // don't need to handle uniform symbol, it will be handled in resolveUniformLocation
    if (resource == EResUbo && type.getBasicType() != EbtBlock) {
        return ent.newBinding = -1;
    }
    // There is no 'set' qualifier in OpenGL shading language, each resource has its own
    // binding name space, so remap the 'set' to resource type which make each resource
    // binding is valid from 0 to MAX_XXRESOURCE_BINDINGS
    int set = referenceIntermediate.getSpv().openGl != 0 ? resource : ent.newSet;
    int resourceKey = set;
    if (resource < EResCount) {
        if (type.getQualifier().hasBinding()) {
            int newBinding = reserveSlot(resourceKey, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            return ent.newBinding = newBinding;

        } else {
            // The resource in current stage is not declared with binding, but it is possible declared
            // with explicit binding in other stages, find the resourceSlotMap firstly to check whether
            // the resource has binding, don't need to allocate if it already has a binding
            bool hasBinding = false;
            ent.newBinding = -1; // leave as -1 if it isn't set below

            if (! resourceSlotMap[resourceKey].empty()) {
                TVarSlotMap::iterator iter = resourceSlotMap[resourceKey].find(name);
                if (iter != resourceSlotMap[resourceKey].end()) {
                    hasBinding = true;
                    ent.newBinding = iter->second;
                }
            }
            if (!hasBinding && (ent.live && doAutoBindingMapping())) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                int binding = getFreeSlot(resourceKey, getBaseBinding(stage, resource, set), numBindings);
                resourceSlotMap[resourceKey][name] = binding;
                ent.newBinding = binding;
            }
            return ent.newBinding;
        }
    }
    return ent.newBinding = -1;
}